

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DefaultCaseItemSyntax::setChild
          (DefaultCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  logic_error *this_00;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index != 2) {
    if (index == 1) {
      pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar2 = pvVar5->field_0x2;
      NVar3.raw = (pvVar5->numFlags).raw;
      uVar4 = pvVar5->rawLen;
      pIVar1 = pvVar5->info;
      (this->colon).kind = pvVar5->kind;
      (this->colon).field_0x2 = uVar2;
      (this->colon).numFlags = (NumericTokenFlags)NVar3.raw;
      (this->colon).rawLen = uVar4;
      (this->colon).info = pIVar1;
    }
    else {
      if (index != 0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
                   ,"");
        plVar7 = (long *)std::__cxx11::string::append((char *)local_d0);
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0.field_2._8_8_ = plVar7[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar8;
        }
        local_b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::to_string(&local_70,0xed3);
        std::operator+(&local_50,&local_b0,&local_70);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90 = (long *)*plVar7;
        plVar9 = plVar7 + 2;
        if (local_90 == plVar9) {
          local_80 = *plVar9;
          lStack_78 = plVar7[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar9;
        }
        local_88 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_f0 = (long *)*plVar7;
        plVar9 = plVar7 + 2;
        if (local_f0 == plVar9) {
          local_e0 = *plVar9;
          lStack_d8 = plVar7[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar9;
        }
        local_e8 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::logic_error::logic_error(this_00,(string *)&local_f0);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar2 = pvVar5->field_0x2;
      NVar3.raw = (pvVar5->numFlags).raw;
      uVar4 = pvVar5->rawLen;
      pIVar1 = pvVar5->info;
      (this->defaultKeyword).kind = pvVar5->kind;
      (this->defaultKeyword).field_0x2 = uVar2;
      (this->defaultKeyword).numFlags = (NumericTokenFlags)NVar3.raw;
      (this->defaultKeyword).rawLen = uVar4;
      (this->defaultKeyword).info = pIVar1;
    }
    return;
  }
  ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  if (*ppSVar6 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      (this->clause).ptr = *ppSVar6;
      return;
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x1b,
             "slang::not_null<slang::syntax::SyntaxNode *>::not_null(U &&) [T = slang::syntax::SyntaxNode *, U = slang::syntax::SyntaxNode *]"
            );
}

Assistant:

void DefaultCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: defaultKeyword = child.token(); return;
        case 1: colon = child.token(); return;
        case 2: clause = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}